

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

void __thiscall QKmsOutput::restoreMode(QKmsOutput *this,QKmsDevice *device)

{
  drmModeCrtcPtr p_Var1;
  
  if ((this->mode_set == true) && (p_Var1 = this->saved_crtc, p_Var1 != (drmModeCrtcPtr)0x0)) {
    drmModeSetCrtc(device->m_dri_fd,p_Var1->crtc_id,p_Var1->buffer_id,0,0,&this->connector_id,1,
                   &p_Var1->mode);
    this->mode_set = false;
  }
  return;
}

Assistant:

void QKmsOutput::restoreMode(QKmsDevice *device)
{
    if (mode_set && saved_crtc) {
        drmModeSetCrtc(device->fd(),
                       saved_crtc->crtc_id,
                       saved_crtc->buffer_id,
                       0, 0,
                       &connector_id, 1,
                       &saved_crtc->mode);
        mode_set = false;
    }
}